

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O2

void __thiscall
SudokuChain::print(SudokuChain *this,PrintTarget target,string *filename,PrintMode mode)

{
  pointer psVar1;
  element_type *peVar2;
  ChainedSudoku *this_00;
  ostream *poVar3;
  int iVar4;
  int iVar5;
  pointer psVar6;
  string local_250;
  ofstream file;
  
  if (target == svg_file_body) {
    std::ofstream::ofstream((ostream *)&file,(filename->_M_dataplus)._M_p,_S_trunc|_S_out);
    iVar4 = this->nFieldsX_;
    iVar5 = this->nFieldsY_;
    std::operator<<((ostream *)&file,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<svg width=\"");
    poVar3 = std::ostream::_M_insert<double>((double)(iVar4 * 0x1e));
    std::operator<<(poVar3,"\" height=\"");
    poVar3 = std::ostream::_M_insert<double>((double)(iVar5 * 0x1e));
    std::operator<<(poVar3,"\">\n<g>\n");
    std::ofstream::close();
    std::ofstream::~ofstream(&file);
  }
  iVar4 = -this->coordinateYbottom_;
  iVar5 = 0;
  psVar1 = (this->sudokuSpecifications_).
           super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->sudokuSpecifications_).
                super__Vector_base<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1) {
    peVar2 = (psVar6->
             super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    iVar5 = iVar5 + peVar2->offset_from_previous_x;
    iVar4 = iVar4 + peVar2->offset_from_previous_y;
    this_00 = *(ChainedSudoku **)(*(long *)&this->sudoku_ + (long)peVar2->sudoku_no * 0x10);
    std::__cxx11::string::string((string *)&local_250,(string *)filename);
    ChainedSudoku::print
              (this_00,target,&local_250,mode,iVar5,iVar4,
               ((psVar6->
                super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->sudoku_no);
    std::__cxx11::string::~string((string *)&local_250);
  }
  if (target == svg_file_body) {
    std::ofstream::ofstream((ostream *)&file,(filename->_M_dataplus)._M_p,_S_out|_S_app);
    std::operator<<((ostream *)&file,"\n</g>\n</svg>\n");
    std::ofstream::close();
    std::ofstream::~ofstream(&file);
  }
  return;
}

Assistant:

void SudokuChain::print(ChainedSudoku::PrintTarget target, std::string filename, ChainedSudoku::PrintMode mode)
{
  if(target == ChainedSudoku::PrintTarget::svg_file_body)
  {
    // begin svg file
    std::ofstream file(filename.c_str(), std::ios::out | std::ios::trunc);
    double width = 30*nFieldsX_;
    double height = 30*nFieldsY_;
    file<<"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<svg width=\""<<width<<"\" height=\""<<height<<"\">\n<g>\n";
    file.close();
  }

  int offset_x = 0;
  int offset_y = -coordinateYbottom_;
  for(auto& specification : sudokuSpecifications_)
  {
    offset_x += specification->offset_from_previous_x;
    offset_y += specification->offset_from_previous_y;
    sudoku_[specification->sudoku_no]->print(target, filename, mode, offset_x, offset_y, specification->sudoku_no+number_offset);
  }

  if(target == ChainedSudoku::PrintTarget::svg_file_body)
  {
    // end svg file
    std::ofstream file(filename.c_str(), std::ios::out | std::ios::app);
    file<<"\n</g>\n</svg>\n";
    file.close();
  }
}